

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_device.c
# Opt level: O1

MPP_RET mpp_dev_multi_offset_init(MppDevRegOffCfgs **cfgs,RK_S32 size)

{
  MppDevRegOffCfgs *pMVar1;
  MPP_RET MVar2;
  
  if (cfgs == (MppDevRegOffCfgs **)0x0 || size < 1) {
    _mpp_log_l(2,"mpp_device","invalid pointer %p size %d\n","mpp_dev_multi_offset_init",cfgs,
               (ulong)(uint)size);
    MVar2 = MPP_NOK;
  }
  else {
    pMVar1 = (MppDevRegOffCfgs *)mpp_osal_calloc("mpp_dev_multi_offset_init",(long)(size * 8 + 8));
    if (pMVar1 != (MppDevRegOffCfgs *)0x0) {
      pMVar1->size = size;
    }
    *cfgs = pMVar1;
    MVar2 = -(uint)(pMVar1 == (MppDevRegOffCfgs *)0x0);
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_dev_multi_offset_init(MppDevRegOffCfgs **cfgs, RK_S32 size)
{
    RK_S32 cfg_size = sizeof(MppDevRegOffCfgs) + size * sizeof(MppDevRegOffsetCfg);
    MppDevRegOffCfgs *p = NULL;

    if (NULL == cfgs || size <= 0) {
        mpp_err_f("invalid pointer %p size %d\n", cfgs, size);
        return MPP_NOK;
    }

    p = mpp_calloc_size(MppDevRegOffCfgs, cfg_size);
    if (p)
        p->size = size;

    *cfgs = p;

    return (p) ? MPP_OK : MPP_NOK;
}